

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

int sndio_stream_start(cubeb_stream_conflict2 *s)

{
  int iVar1;
  void *in_RDI;
  int err;
  int local_4;
  
  *(undefined4 *)((long)in_RDI + 0x4c) = 1;
  iVar1 = pthread_create((pthread_t *)((long)in_RDI + 0x10),(pthread_attr_t *)0x0,sndio_mainloop,
                         in_RDI);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    *(undefined4 *)((long)in_RDI + 0x4c) = 0;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
sndio_stream_start(cubeb_stream *s)
{
  int err;

  DPR("sndio_stream_start()\n");
  s->active = 1;
  err = pthread_create(&s->th, NULL, sndio_mainloop, s);
  if (err) {
    s->active = 0;
    return CUBEB_ERROR;
  }
  return CUBEB_OK;
}